

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::Clear(CharSet<unsigned_int> *this,ArenaAllocator *allocator)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if ((4 < *(long *)((long)&this->characterPlanes[0].rep + lVar3) - 1U) &&
       (puVar2 = *(undefined8 **)((long)&this->characterPlanes[0].rep + lVar3),
       puVar2 != (undefined8 *)0x0)) {
      (**(code **)*puVar2)(puVar2,allocator);
    }
    *(undefined8 *)((long)&this->characterPlanes[0].rep + lVar3) = 1;
    puVar1 = (undefined4 *)((long)&this->characterPlanes[0].rep + lVar3 + 8);
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x2a8);
  return;
}

Assistant:

void CharSet<codepoint_t>::Clear(ArenaAllocator* allocator)
    {
        for (int i = 0; i < NumberOfPlanes; i++)
        {
            this->characterPlanes[i].Clear(allocator);
        }
    }